

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall
File::writeMechanismTypeSet
          (File *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value)

{
  bool bVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  
  if ((this->valid == true) &&
     (bVar1 = writeULong(this,(value->_M_t)._M_impl.super__Rb_tree_header._M_node_count), bVar1)) {
    p_Var3 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      bVar1 = (_Rb_tree_header *)p_Var3 == &(value->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar1) {
        return bVar1;
      }
      bVar2 = writeULong(this,*(unsigned_long *)(p_Var3 + 1));
      if (!bVar2) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool File::writeMechanismTypeSet(const std::set<CK_MECHANISM_TYPE>& value)
{
	if (!valid) return false;

	// write length
	if (!writeULong(value.size()))
	{
		return false;
	}

	// write each value
	for (std::set<CK_MECHANISM_TYPE>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		if (!writeULong(*i)) return false;
	}

	return true;
}